

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O3

bool __thiscall NodeView::is_bubble_side(NodeView *this)

{
  bool bVar1;
  vector<LinkView,_std::allocator<LinkView>_> n;
  vector<LinkView,_std::allocator<LinkView>_> p;
  vector<LinkView,_std::allocator<LinkView>_> local_a0;
  vector<LinkView,_std::allocator<LinkView>_> local_88;
  vector<NodeView,_std::allocator<NodeView>_> local_70;
  vector<LinkView,_std::allocator<LinkView>_> local_58;
  vector<LinkView,_std::allocator<LinkView>_> local_40;
  NodeView local_28;
  NodeView local_18;
  
  prev(&local_58,this);
  next(&local_a0,this);
  parallels(&local_70,this);
  if ((((long)local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) &&
      ((long)local_58.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_58.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
             super__Vector_impl_data._M_start == 0x28)) &&
     ((long)local_a0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_a0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_start == 0x28)) {
    local_18.id = ((local_58.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start)->node_view).id;
    local_18.dg = ((local_58.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start)->node_view).dg;
    next(&local_88,&local_18);
    if ((long)local_88.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_88.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
              super__Vector_impl_data._M_start == 0x50) {
      local_28.id = ((local_a0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start)->node_view).id;
      local_28.dg = ((local_a0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start)->node_view).dg;
      prev(&local_40,&local_28);
      bVar1 = (long)local_40.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_40.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x50;
      if (local_40.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar1 = false;
    }
    if (local_88.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar1 = false;
  }
  if (local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool NodeView::is_bubble_side() const {
    auto p=prev();
    auto n=next();
    if ( parallels().size()== 1 and p.size()==1 and n.size()==1 and p[0].node().next().size()==2 and n[0].node().prev().size()==2) {
        return true;
    }
    return false;
}